

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O1

int libpd_process_short(int ticks,short *inBuffer,short *outBuffer)

{
  short sVar1;
  int iVar2;
  _instancestuff *p_Var3;
  float *pfVar4;
  t_sample *ptVar5;
  int iVar6;
  float *pfVar7;
  int iVar8;
  t_sample *ptVar9;
  int iVar10;
  
  sys_lock();
  sys_pollgui();
  if (0 < ticks) {
    iVar10 = 0;
    do {
      p_Var3 = pd_maininstance.pd_stuff;
      ptVar5 = (pd_maininstance.pd_stuff)->st_soundin;
      iVar2 = (pd_maininstance.pd_stuff)->st_inchannels;
      iVar6 = 0;
      do {
        ptVar9 = ptVar5;
        iVar8 = iVar2;
        if (0 < iVar2) {
          do {
            sVar1 = *inBuffer;
            inBuffer = inBuffer + 1;
            *ptVar9 = (float)(int)sVar1 * 3.051851e-05;
            iVar8 = iVar8 + -1;
            ptVar9 = ptVar9 + 0x40;
          } while (iVar8 != 0);
        }
        iVar6 = iVar6 + 1;
        ptVar5 = ptVar5 + 1;
      } while (iVar6 != 0x40);
      iVar6 = 0;
      memset(p_Var3->st_soundout,0,(long)p_Var3->st_outchannels << 8);
      sched_tick();
      pfVar4 = (pd_maininstance.pd_stuff)->st_soundout;
      iVar2 = (pd_maininstance.pd_stuff)->st_outchannels;
      do {
        pfVar7 = pfVar4;
        iVar8 = iVar2;
        if (0 < iVar2) {
          do {
            *outBuffer = (short)(int)(*pfVar7 * 32767.0);
            outBuffer = outBuffer + 1;
            iVar8 = iVar8 + -1;
            pfVar7 = pfVar7 + 0x40;
          } while (iVar8 != 0);
        }
        iVar6 = iVar6 + 1;
        pfVar4 = pfVar4 + 1;
      } while (iVar6 != 0x40);
      iVar10 = iVar10 + 1;
    } while (iVar10 != ticks);
  }
  sys_unlock();
  return 0;
}

Assistant:

int libpd_process_short(const int ticks, const short *inBuffer, short *outBuffer) {
  PROCESS(* short_to_sample, * sample_to_short)
}